

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall libcellml::Component::removeAllResets(Component *this)

{
  bool bVar1;
  ComponentImpl *pCVar2;
  __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ResetImpl *this_02;
  shared_ptr<libcellml::Reset> *reset;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
  *__range1;
  Component *this_local;
  
  pCVar2 = pFunc(this);
  __end1 = std::
           vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
           ::begin(&pCVar2->mResets);
  reset = (shared_ptr<libcellml::Reset> *)
          std::
          vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
          ::end(&pCVar2->mResets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
                                *)&reset);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    this_02 = Reset::pFunc(this_01);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_02->super_ParentedEntityImpl);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
    ::operator++(&__end1);
  }
  pCVar2 = pFunc(this);
  std::
  vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
  clear(&pCVar2->mResets);
  return;
}

Assistant:

void Component::removeAllResets()
{
    for (const auto &reset : pFunc()->mResets) {
        reset->pFunc()->removeParent();
    }
    pFunc()->mResets.clear();
}